

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O2

CustomTabulated *
TasGrid::getExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int num_levels,double shift,
          function<double_(double)> *weight_fn,int num_ref_points,char *description,
          bool is_symmetric)

{
  pointer __first;
  pointer __last;
  undefined7 in_register_00000089;
  vector<double,_std::allocator<double>_> ref_points;
  vector<double,_std::allocator<double>_> shifted_weights;
  vector<double,_std::allocator<double>_> weight_fn_vals;
  allocator_type local_b5;
  undefined4 local_b4;
  double local_b0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_88;
  char *local_70;
  _Vector_base<double,_std::allocator<double>_> local_68;
  function<double_(double)> local_50;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000089,is_symmetric);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = shift;
  local_70 = description;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,(long)num_ref_points,&local_b5);
  TasGrid::OneDimensionalNodes::getGaussLegendre
            (num_ref_points,(vector *)&local_88,(vector *)&local_a8);
  __last = local_a8._M_impl.super__Vector_impl_data._M_finish;
  __first = local_a8._M_impl.super__Vector_impl_data._M_start;
  std::function<double_(double)>::function(&local_50,weight_fn);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<double(double)>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__first,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__last,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_68._M_impl.super__Vector_impl_data._M_start,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  shiftReferenceWeights
            ((vector<double,_std::allocator<double>_> *)&local_68,local_b0,
             (vector<double,_std::allocator<double>_> *)&local_88);
  getShiftedExoticQuadrature
            (__return_storage_ptr__,num_levels,local_b0,
             (vector<double,_std::allocator<double>_> *)&local_88,
             (vector<double,_std::allocator<double>_> *)&local_a8,local_70,local_b4._0_1_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

inline TasGrid::CustomTabulated getExoticQuadrature(const int num_levels, const double shift, std::function<double(double)> weight_fn,
                                                    const int num_ref_points, const char* description, const bool is_symmetric = false) {
    std::vector<double> shifted_weights, ref_points, weight_fn_vals(num_ref_points);
    TasGrid::OneDimensionalNodes::getGaussLegendre(num_ref_points, shifted_weights, ref_points);
    std::transform(ref_points.begin(), ref_points.end(), weight_fn_vals.begin(), weight_fn);
    shiftReferenceWeights(weight_fn_vals, shift, shifted_weights);
    return getShiftedExoticQuadrature(num_levels, shift, shifted_weights, ref_points, description, is_symmetric);
}